

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerPointers.h
# Opt level: O0

void Memory::_ArrayWriteBarrier<Memory::_no_write_barrier_policy>::WriteBarrier<Wasm::WasmImport*>
               (WasmImport **address,size_t count)

{
  size_t count_local;
  WasmImport **address_local;
  
  if (((DAT_01eca37c & 1) != 0) && (g_verifyIsNotBarrierAddress != (code *)0x0)) {
    (*g_verifyIsNotBarrierAddress)(address,count);
  }
  return;
}

Assistant:

static void WriteBarrier(T * address, size_t count)
    {
#if defined(RECYCLER_WRITE_BARRIER)
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.StrictWriteBarrierCheck)
        {
            if (g_verifyIsNotBarrierAddress)
            {
                g_verifyIsNotBarrierAddress(address, count);
            }
        }
#endif
#endif
    }